

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint *pmVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong *puVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t nblimbs;
  long lVar9;
  bool bVar10;
  
  bVar10 = X == B;
  if (bVar10) {
    B = A;
  }
  if ((A == X || bVar10) || (iVar3 = mbedtls_mpi_copy(X,A), iVar3 == 0)) {
    X->s = 1;
    nblimbs = B->n;
    if (nblimbs != 0) {
      do {
        if (B->p[nblimbs - 1] != 0) goto LAB_0014b7ea;
        nblimbs = nblimbs - 1;
      } while (nblimbs != 0);
      nblimbs = 0;
    }
LAB_0014b7ea:
    iVar3 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar3 == 0) {
      puVar5 = X->p;
      iVar3 = 0;
      if (nblimbs == 0) {
        uVar8 = 0;
        uVar7 = 0;
      }
      else {
        pmVar1 = B->p;
        uVar8 = 0;
        sVar6 = 0;
        do {
          uVar2 = *puVar5;
          uVar7 = uVar8 + uVar2;
          *puVar5 = uVar7;
          uVar7 = uVar7 + pmVar1[sVar6];
          *puVar5 = uVar7;
          uVar8 = (ulong)(uVar7 < pmVar1[sVar6]) + (ulong)CARRY8(uVar8,uVar2);
          sVar6 = sVar6 + 1;
          puVar5 = puVar5 + 1;
          uVar7 = nblimbs;
        } while (nblimbs != sVar6);
      }
      if (uVar8 != 0) {
        lVar9 = nblimbs << 3;
        do {
          if (X->n <= uVar7) {
            iVar4 = mbedtls_mpi_grow(X,uVar7 + 1);
            if (iVar4 != 0) {
              return iVar4;
            }
            puVar5 = (ulong *)((long)X->p + lVar9);
          }
          uVar7 = uVar7 + 1;
          lVar9 = lVar9 + 8;
          bVar10 = CARRY8(*puVar5,uVar8);
          *puVar5 = *puVar5 + uVar8;
          puVar5 = puVar5 + 1;
          uVar8 = (ulong)bVar10;
        } while (bVar10);
      }
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    for( i = 0; i < j; i++, o++, p++ )
    {
        *p +=  c; c  = ( *p <  c );
        *p += *o; c += ( *p < *o );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}